

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::clear(raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
        *this)

{
  ulong uVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (uVar1 < 0x80) {
      if (uVar1 != 0) {
        lVar3 = 0;
        for (uVar2 = 0; uVar2 != uVar1; uVar2 = uVar2 + 1) {
          if (-1 < this->ctrl_[uVar2]) {
            node_hash_policy<std::pair<unsigned_long_const,VarState>&,phmap::container_internal::NodeHashMapPolicy<unsigned_long,VarState>>
            ::destroy<std::allocator<std::pair<unsigned_long_const,VarState>>>
                      ((allocator<std::pair<const_unsigned_long,_VarState>_> *)&this->settings_,
                       (slot_type *)((long)this->slots_ + lVar3));
            uVar1 = this->capacity_;
          }
          lVar3 = lVar3 + 8;
        }
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar1 + 0x10);
        this->ctrl_[this->capacity_] = -1;
        reset_growth_left(this);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x4c3,
                    "void phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, VarState>>>::clear() [Policy = phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, VarState>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }